

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

void __thiscall ev3dev::button::button(button *this,int bit)

{
  int iVar1;
  value_type_conflict2 *__val;
  pointer puVar2;
  file_descriptor *__p;
  
  (this->onclick).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onclick)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->onclick).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onclick).super__Function_base._M_functor + 8) = 0;
  this->_bit = bit;
  this->_state = false;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (pointer)operator_new(0x60);
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar2;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar2 + 0xc;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  (this->_buf).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2 + 0xc;
  __p = (file_descriptor *)operator_new(4);
  iVar1 = open("/dev/input/by-path/platform-gpio_keys-event",0);
  __p->_fd = iVar1;
  (this->_fd).super___shared_ptr<ev3dev::button::file_descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ev3dev::button::file_descriptor*>
            (&(this->_fd).
              super___shared_ptr<ev3dev::button::file_descriptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  return;
}

Assistant:

button::button(int bit)
    : _bit(bit),
      _buf((KEY_CNT + bits_per_long - 1) / bits_per_long),
      _fd( new file_descriptor("/dev/input/by-path/platform-gpio_keys-event", O_RDONLY) )
{ }